

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O3

bool __thiscall QCheckBox::hitButton(QCheckBox *this,QPoint *pos)

{
  undefined1 uVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QStyleOptionButton opt;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))
            (this,(QStyleOptionButton *)local_a8);
  pQVar2 = QWidget::style((QWidget *)this);
  local_b8 = (**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,5,(QStyleOptionButton *)local_a8,this);
  uVar1 = QRect::contains((QPoint *)local_b8,SUB81(pos,0));
  QIcon::~QIcon(&local_48);
  if (pQStack_60 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_60,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QCheckBox::hitButton(const QPoint &pos) const
{
    QStyleOptionButton opt;
    initStyleOption(&opt);
    return style()->subElementRect(QStyle::SE_CheckBoxClickRect, &opt, this).contains(pos);
}